

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsystemtraytracker.cpp
# Opt level: O2

QXcbSystemTrayTracker * QXcbSystemTrayTracker::create(QXcbConnection *connection)

{
  xcb_atom_t trayAtom;
  xcb_atom_t selection;
  QXcbSystemTrayTracker *this;
  char *name;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d0;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char> local_a0;
  QStringBuilder<QByteArray,_QByteArray> local_88;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  trayAtom = (connection->super_QXcbBasicConnection).m_xcbAtom.m_allAtoms[8];
  if (trayAtom == 0) {
    this = (QXcbSystemTrayTracker *)0x0;
  }
  else {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_a0.d = (Data *)0x0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char *)0x0;
    local_b8.size = 0;
    local_a0.ptr = "_NET_SYSTEM_TRAY_S";
    local_a0.size = 0x12;
    QByteArray::number((int)&local_d0,(connection->super_QXcbBasicConnection).m_primaryScreenNumber)
    ;
    QStringBuilder<QByteArray,_QByteArray>::QStringBuilder
              (&local_88,(QByteArray *)&local_a0,(QByteArray *)&local_d0);
    QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>((QByteArray *)&local_58,&local_88)
    ;
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder(&local_88);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
    name = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      name = (char *)&QByteArray::_empty;
    }
    selection = QXcbBasicConnection::internAtom((QXcbBasicConnection *)connection,name);
    if (selection == 0) {
      this = (QXcbSystemTrayTracker *)0x0;
    }
    else {
      this = (QXcbSystemTrayTracker *)operator_new(0x30);
      QXcbSystemTrayTracker((QXcbSystemTrayTracker *)this,connection,trayAtom,selection);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QXcbSystemTrayTracker *QXcbSystemTrayTracker::create(QXcbConnection *connection)
{
    // Selection, tray atoms for GNOME, NET WM Specification
    const xcb_atom_t trayAtom = connection->atom(QXcbAtom::Atom_NET_SYSTEM_TRAY_OPCODE);
    if (!trayAtom)
        return nullptr;
    const QByteArray netSysTray = QByteArrayLiteral("_NET_SYSTEM_TRAY_S") + QByteArray::number(connection->primaryScreenNumber());
    const xcb_atom_t selection = connection->internAtom(netSysTray.constData());
    if (!selection)
        return nullptr;

    return new QXcbSystemTrayTracker(connection, trayAtom, selection);
}